

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O1

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *args;
  SyntaxNode *args_1;
  DeclaratorSyntax *args_2;
  ImplicitAnsiPortSyntax *pIVar1;
  DeepCloneVisitor visitor;
  DeepCloneVisitor visitor_1;
  DeepCloneVisitor local_22;
  DeepCloneVisitor local_21;
  
  args = deepClone<slang::syntax::AttributeInstanceSyntax>
                   ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)(__fn + 0x18),
                    (BumpAllocator *)__child_stack);
  args_1 = detail::
           visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                     (*(SyntaxNode **)(__fn + 0x50),&local_22,(BumpAllocator *)__child_stack);
  args_2 = (DeclaratorSyntax *)
           detail::
           visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                     (*(SyntaxNode **)(__fn + 0x58),&local_21,(BumpAllocator *)__child_stack);
  pIVar1 = BumpAllocator::
           emplace<slang::syntax::ImplicitAnsiPortSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::syntax::PortHeaderSyntax&,slang::syntax::DeclaratorSyntax&>
                     ((BumpAllocator *)__child_stack,args,(PortHeaderSyntax *)args_1,args_2);
  return (int)pIVar1;
}

Assistant:

static SyntaxNode* clone(const ImplicitAnsiPortSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<ImplicitAnsiPortSyntax>(
        *deepClone(node.attributes, alloc),
        *deepClone<PortHeaderSyntax>(*node.header, alloc),
        *deepClone<DeclaratorSyntax>(*node.declarator, alloc)
    );
}